

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RabbitMq.cpp
# Opt level: O1

Url * __thiscall Vault::RabbitMq::getUrl(Url *__return_storage_ptr__,RabbitMq *this,Path *path)

{
  long *plVar1;
  long *local_48 [2];
  long local_38 [2];
  
  plVar1 = *(long **)this;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"/v1/rabbitmq/","");
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_48,path);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::RabbitMq::getUrl(const Path &path) {
  return client_.getUrl("/v1/rabbitmq/", path);
}